

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O0

void * __thiscall phosg::StringReader::pgetv(StringReader *this,size_t offset,size_t size)

{
  out_of_range *this_00;
  size_t size_local;
  size_t offset_local;
  StringReader *this_local;
  
  if (this->length < offset + size) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"end of string");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  return this->data + offset;
}

Assistant:

inline const void* pgetv(size_t offset, size_t size) const {
    if (offset + size > this->length) {
      throw std::out_of_range("end of string");
    }
    return this->data + offset;
  }